

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O2

void __thiscall Merge::inflate(Merge *this,Varnode *a,HighVariable *high)

{
  pointer ppVVar1;
  HighVariable *pHVar2;
  int4 i;
  long lVar3;
  
  pHVar2 = Varnode::getHigh(a);
  updateHigh(this,pHVar2);
  updateHigh(this,high);
  for (lVar3 = 0;
      ppVVar1 = (high->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(high->inst).
                                  super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3);
      lVar3 = lVar3 + 1) {
    Cover::merge(a->cover,ppVVar1[lVar3]->cover);
  }
  pHVar2 = Varnode::getHigh(a);
  *(byte *)&pHVar2->highflags = (byte)pHVar2->highflags | 4;
  return;
}

Assistant:

void Merge::inflate(Varnode *a,HighVariable *high)

{
  updateHigh(a->getHigh());
  updateHigh(high);
  for(int4 i=0;i<high->numInstances();++i) {
    Varnode *b = high->getInstance(i);
    a->cover->merge(*b->cover);
  }
  a->getHigh()->coverDirty();
}